

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O1

int __thiscall CVmFormatter::get_buffer_maxcol(CVmFormatter *this)

{
  int iVar1;
  
  if ((this->field_0xef82 & 1) == 0) {
    iVar1 = (*this->console_->_vptr_CVmConsole[6])();
    return iVar1;
  }
  return 0x800;
}

Assistant:

virtual int get_buffer_maxcol() const
    {
        /* 
         *   if the OS is doing the line wrapping, use the full buffer;
         *   otherwise, use the actual line width from the underyling
         *   console 
         */
        if (os_line_wrap_)
            return OS_MAXWIDTH;
        else
            return console_->get_line_width();
    }